

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgMinLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  undefined8 layer_00;
  bool bVar1;
  int iVar2;
  Result *pRVar3;
  ArgMinLayerParams *this_00;
  Tensor *this_01;
  int64 iVar4;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  ArgMinLayerParams *pAStack_100;
  int rank;
  ArgMinLayerParams *params;
  undefined1 local_f0 [32];
  undefined1 local_d0 [40];
  Result local_a8;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,1,1);
  pRVar3 = Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  bVar1 = Result::good(pRVar3);
  Result::~Result((Result *)local_70);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    validateOutputCount((Result_conflict *)(local_d0 + 0x28),(NeuralNetworkLayer *)r._32_8_,1,1);
    pRVar3 = Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_d0 + 0x28));
    bVar1 = Result::good(pRVar3);
    Result::~Result((Result *)(local_d0 + 0x28));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_00 = Specification::NeuralNetworkLayer::argmin((NeuralNetworkLayer *)r._32_8_);
      bVar1 = Specification::ArgMinLayerParams::removedim(this_00);
      layer_00 = r._32_8_;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_f0,"ArgMin",(allocator *)((long)&params + 7));
        validateInputOutputRankEquality
                  ((Result_conflict *)local_d0,(NeuralNetworkLayer *)layer_00,(string *)local_f0,
                   &this->blobNameToRank);
        pRVar3 = Result::operator=((Result *)(local_70 + 0x28),(Result *)local_d0);
        bVar1 = Result::good(pRVar3);
        Result::~Result((Result *)local_d0);
        std::__cxx11::string::~string((string *)local_f0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
          local_a8.m_message._M_storage._M_storage[0] = '\x01';
          local_a8.m_message._M_storage._M_storage[1] = '\0';
          local_a8.m_message._M_storage._M_storage[2] = '\0';
          local_a8.m_message._M_storage._M_storage[3] = '\0';
          goto LAB_0041f1c1;
        }
      }
      iVar2 = Specification::NeuralNetworkLayer::inputtensor_size((NeuralNetworkLayer *)r._32_8_);
      if (0 < iVar2) {
        pAStack_100 = Specification::NeuralNetworkLayer::argmin((NeuralNetworkLayer *)r._32_8_);
        this_01 = Specification::NeuralNetworkLayer::inputtensor((NeuralNetworkLayer *)r._32_8_,0);
        local_128._M_storage._M_storage._4_4_ = Specification::Tensor::rank(this_01);
        iVar4 = Specification::ArgMinLayerParams::axis(pAStack_100);
        if ((iVar4 < (int)-local_128._M_storage._M_storage._4_4_) ||
           (iVar4 = Specification::ArgMinLayerParams::axis(pAStack_100),
           (int)local_128._M_storage._M_storage._4_4_ <= iVar4)) {
          __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_)
          ;
          std::operator+(&local_148,
                         "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_128,&local_148,"\' layer.");
          std::__cxx11::string::~string((string *)&local_148);
          Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_128);
          local_a8.m_message._M_storage._M_storage[0] = '\x01';
          local_a8.m_message._M_storage._M_storage[1] = '\0';
          local_a8.m_message._M_storage._M_storage[2] = '\0';
          local_a8.m_message._M_storage._M_storage[3] = '\0';
          std::__cxx11::string::~string((string *)&local_128);
          goto LAB_0041f1c1;
        }
      }
      Result::Result((Result *)__return_storage_ptr__);
      local_a8.m_message._M_storage._M_storage[0] = '\x01';
      local_a8.m_message._M_storage._M_storage[1] = '\0';
      local_a8.m_message._M_storage._M_storage[2] = '\0';
      local_a8.m_message._M_storage._M_storage[3] = '\0';
    }
    else {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      local_a8.m_message._M_storage._M_storage[0] = '\x01';
      local_a8.m_message._M_storage._M_storage[1] = '\0';
      local_a8.m_message._M_storage._M_storage[2] = '\0';
      local_a8.m_message._M_storage._M_storage[3] = '\0';
    }
  }
  else {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    local_a8.m_message._M_storage._M_storage[0] = '\x01';
    local_a8.m_message._M_storage._M_storage[1] = '\0';
    local_a8.m_message._M_storage._M_storage[2] = '\0';
    local_a8.m_message._M_storage._M_storage[3] = '\0';
  }
LAB_0041f1c1:
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgMinLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;
    if (!layer.argmin().removedim()) {
        if (!(r = validateInputOutputRankEquality(layer, "ArgMin", blobNameToRank)).good()) return r;
    }
    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.argmin();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}